

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O2

void __thiscall amrex::MultiFab::initVal(MultiFab *this)

{
  int iVar1;
  MFIter mfi;
  MFIter local_70;
  
  MFIter::MFIter(&local_70,(FabArrayBase *)this,'\0');
  while (local_70.currentIndex < local_70.endIndex) {
    iVar1 = local_70.currentIndex;
    if (local_70.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      iVar1 = ((local_70.local_index_map)->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [local_70.currentIndex];
    }
    FArrayBox::initVal((this->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                       super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[iVar1]);
    MFIter::operator++(&local_70);
  }
  MFIter::~MFIter(&local_70);
  return;
}

Assistant:

void
MultiFab::initVal ()
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*this); mfi.isValid(); ++mfi)
    {
        FArrayBox& fab = (*this)[mfi];
        fab.initVal();
    }
}